

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JsrtDebugManager.cpp
# Opt level: O0

void __thiscall
JsrtDebugManager::GetBreakpoints
          (JsrtDebugManager *this,JavascriptArray **bpsArray,ScriptContext *scriptContext)

{
  anon_class_24_3_7976d136 map;
  DebugContext *this_00;
  ProbeContainer *this_01;
  ProbeContainer *probeContainer;
  ScriptContext *arrayScriptContext;
  ScriptContext *scriptContext_local;
  JavascriptArray **bpsArray_local;
  JsrtDebugManager *this_local;
  
  arrayScriptContext = scriptContext;
  scriptContext_local = (ScriptContext *)bpsArray;
  bpsArray_local = (JavascriptArray **)this;
  probeContainer =
       (ProbeContainer *)Js::RecyclableObject::GetScriptContext((RecyclableObject *)*bpsArray);
  this_00 = Js::ScriptContext::GetDebugContext(arrayScriptContext);
  this_01 = Js::DebugContext::GetProbeContainer(this_00);
  map.arrayScriptContext = (ScriptContext **)&probeContainer;
  map.scriptContext = &arrayScriptContext;
  map.bpsArray = (JavascriptArray ***)&scriptContext_local;
  Js::ProbeContainer::
  MapProbes<JsrtDebugManager::GetBreakpoints(Js::JavascriptArray**,Js::ScriptContext*)::__0>
            (this_01,map);
  return;
}

Assistant:

void JsrtDebugManager::GetBreakpoints(Js::JavascriptArray** bpsArray, Js::ScriptContext* scriptContext)
{
    Js::ScriptContext* arrayScriptContext = (*bpsArray)->GetScriptContext();
    Js::ProbeContainer* probeContainer = scriptContext->GetDebugContext()->GetProbeContainer();

    probeContainer->MapProbes([&](int i, Js::Probe* pProbe)
    {
        Js::BreakpointProbe* bp = (Js::BreakpointProbe*)pProbe;
        Js::DynamicObject* bpObject = scriptContext->GetLibrary()->CreateObject();

        JsrtDebugUtils::AddPropertyToObject(bpObject, JsrtDebugPropertyId::breakpointId, bp->GetId(), scriptContext);
        JsrtDebugUtils::AddLineColumnToObject(bpObject, bp->GetFunctionBody(), bp->GetBytecodeOffset());

        Js::Utf8SourceInfo* utf8SourceInfo = bp->GetDbugDocument()->GetUtf8SourceInfo();
        JsrtDebugUtils::AddScriptIdToObject(bpObject, utf8SourceInfo);

        Js::Var marshaledObj = Js::CrossSite::MarshalVar(arrayScriptContext, bpObject);
        Js::JavascriptOperators::OP_SetElementI((Js::Var)(*bpsArray), Js::JavascriptNumber::ToVar((*bpsArray)->GetLength(), arrayScriptContext), marshaledObj, arrayScriptContext);
    });
}